

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DelayedDestructor.hpp
# Opt level: O0

void __thiscall
gmlc::concurrency::DelayedDestructor<helics::Core>::~DelayedDestructor
          (DelayedDestructor<helics::Core> *this)

{
  bool bVar1;
  duration<long,_std::ratio<1L,_1000L>_> *in_stack_00000010;
  int ii;
  DelayedDestructor<helics::Core> *in_stack_00000118;
  undefined4 in_stack_ffffffffffffffe0;
  int in_stack_ffffffffffffffe4;
  duration<long,std::ratio<1l,1000l>> local_18 [8];
  undefined4 local_10;
  int local_c;
  
  local_c = 0;
  do {
    do {
      bVar1 = std::
              vector<std::shared_ptr<helics::Core>,_std::allocator<std::shared_ptr<helics::Core>_>_>
              ::empty((vector<std::shared_ptr<helics::Core>,_std::allocator<std::shared_ptr<helics::Core>_>_>
                       *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
      if (((bVar1 ^ 0xffU) & 1) == 0) {
LAB_004312a6:
        local_10 = 0;
LAB_004312ae:
        TripWireDetector::~TripWireDetector((TripWireDetector *)0x4312bb);
        std::function<void_(std::shared_ptr<helics::Core>_&)>::~function
                  ((function<void_(std::shared_ptr<helics::Core>_&)> *)0x4312c8);
        std::vector<std::shared_ptr<helics::Core>,_std::allocator<std::shared_ptr<helics::Core>_>_>
        ::~vector((vector<std::shared_ptr<helics::Core>,_std::allocator<std::shared_ptr<helics::Core>_>_>
                   *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
        return;
      }
      local_c = local_c + 1;
      destroyObjects(in_stack_00000118);
      bVar1 = std::
              vector<std::shared_ptr<helics::Core>,_std::allocator<std::shared_ptr<helics::Core>_>_>
              ::empty((vector<std::shared_ptr<helics::Core>,_std::allocator<std::shared_ptr<helics::Core>_>_>
                       *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
    } while (bVar1);
    bVar1 = TripWireDetector::isTripped((TripWireDetector *)0x431228);
    if (bVar1) {
      local_10 = 1;
      goto LAB_004312ae;
    }
    if (4 < local_c) {
      destroyObjects(in_stack_00000118);
      goto LAB_004312a6;
    }
    if (local_c % 2 == 0) {
      in_stack_ffffffffffffffe4 = 100;
      std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
                (local_18,(int *)&stack0xffffffffffffffe4);
      std::this_thread::sleep_for<long,std::ratio<1l,1000l>>(in_stack_00000010);
    }
    else {
      std::this_thread::yield();
    }
  } while( true );
}

Assistant:

~DelayedDestructor()
    {
        try {
            int ii = 0;
            while (!ElementsToBeDestroyed.empty()) {
                ++ii;
                destroyObjects();
                if (!ElementsToBeDestroyed.empty()) {
#ifdef ENABLE_TRIPWIRE
                    // short circuit if the tripline was triggered
                    if (tripDetect.isTripped()) {
                        return;
                    }
#endif
                    if (ii > 4) {
                        destroyObjects();
                        break;
                    }
                    if (ii % 2 == 0) {
                        std::this_thread::sleep_for(
                            std::chrono::milliseconds(100));
                    } else {
                        std::this_thread::yield();
                    }
                }
            }
        }
        catch (...) {
        }
    }